

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_relocate_overlap_n<OrderedScreen,long_long>
               (OrderedScreen *first,longlong n,OrderedScreen *d_first)

{
  ulong in_RDX;
  long in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  OrderedScreen *unaff_retaddr;
  reverse_iterator<OrderedScreen_*> rd_first;
  reverse_iterator<OrderedScreen_*> rfirst;
  OrderedScreen *in_stack_ffffffffffffffb8;
  reverse_iterator<OrderedScreen_*> in_stack_ffffffffffffffd8;
  reverse_iterator<OrderedScreen_*> in_stack_ffffffffffffffe0;
  reverse_iterator<OrderedScreen_*> first_00;
  reverse_iterator<OrderedScreen_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_RSI != 0) && (in_RDI != in_RDX)) && (in_RDI != 0)) && (in_RDX != 0)) {
    if (in_RDX < in_RDI) {
      q_relocate_overlap_n_left_move<OrderedScreen*,long_long>(d_first,in_RSI,unaff_retaddr);
    }
    else {
      local_10.current = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
      std::make_reverse_iterator<OrderedScreen*>(in_stack_ffffffffffffffb8);
      first_00.current = (OrderedScreen *)0xaaaaaaaaaaaaaaaa;
      std::make_reverse_iterator<OrderedScreen*>(in_stack_ffffffffffffffb8);
      std::reverse_iterator<OrderedScreen_*>::reverse_iterator
                ((reverse_iterator<OrderedScreen_*> *)&stack0xffffffffffffffe0,&local_10);
      std::reverse_iterator<OrderedScreen_*>::reverse_iterator
                ((reverse_iterator<OrderedScreen_*> *)&stack0xffffffffffffffd8,
                 (reverse_iterator<OrderedScreen_*> *)&stack0xffffffffffffffe8);
      q_relocate_overlap_n_left_move<std::reverse_iterator<OrderedScreen*>,long_long>
                ((reverse_iterator<OrderedScreen_*> *)first_00.current,
                 (longlong)in_stack_ffffffffffffffe0.current,
                 (reverse_iterator<OrderedScreen_*> *)in_stack_ffffffffffffffd8.current);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n(T *first, N n, T *d_first)
{
    static_assert(std::is_nothrow_destructible_v<T>,
                  "This algorithm requires that T has a non-throwing destructor");

    if (n == N(0) || first == d_first || first == nullptr || d_first == nullptr)
        return;

    if constexpr (QTypeInfo<T>::isRelocatable) {
        std::memmove(static_cast<void *>(d_first), static_cast<const void *>(first), n * sizeof(T));
    } else { // generic version has to be used
        if (d_first < first) {
            q_relocate_overlap_n_left_move(first, n, d_first);
        } else { // first < d_first
            auto rfirst = std::make_reverse_iterator(first + n);
            auto rd_first = std::make_reverse_iterator(d_first + n);
            q_relocate_overlap_n_left_move(rfirst, n, rd_first);
        }
    }
}